

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O1

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::EnumTypeInfo::Deserialize(EnumTypeInfo *this,Deserializer *deserializer)

{
  PhysicalType PVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  InternalException *this_00;
  __shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar5;
  _Alloc_hider local_48;
  size_type sStack_40;
  idx_t size;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"values_count");
  iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  size = CONCAT44(extraout_var,iVar2);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  PVar1 = DictType(size);
  if (PVar1 == UINT32) {
    uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(size);
    _Var4 = (__shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
            EnumTypeInfoTemplated<unsigned_int>::Deserialize
                      ((EnumTypeInfoTemplated<unsigned_int> *)&stack0xffffffffffffffb8,deserializer,
                       uVar3);
  }
  else if (PVar1 == UINT16) {
    uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(size);
    _Var4 = (__shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
            EnumTypeInfoTemplated<unsigned_short>::Deserialize
                      ((EnumTypeInfoTemplated<unsigned_short> *)&stack0xffffffffffffffb8,
                       deserializer,uVar3);
  }
  else {
    if (PVar1 != UINT8) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_48._M_p = &stack0xffffffffffffffc8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffffb8,"Invalid Physical Type for ENUMs","");
      InternalException::InternalException(this_00,(string *)&stack0xffffffffffffffb8);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(size);
    _Var4 = (__shared_ptr<duckdb::EnumTypeInfoTemplated<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
            EnumTypeInfoTemplated<unsigned_char>::Deserialize
                      ((EnumTypeInfoTemplated<unsigned_char> *)&stack0xffffffffffffffb8,deserializer
                       ,uVar3);
  }
  sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_refcount._M_pi;
  *(undefined8 *)&(this->super_ExtraTypeInfo).type = 0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo = (_func_int **)local_48._M_p;
  *(size_type *)&(this->super_ExtraTypeInfo).type = sStack_40;
  sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> EnumTypeInfo::Deserialize(Deserializer &deserializer) {
	auto values_count = deserializer.ReadProperty<idx_t>(200, "values_count");
	auto enum_internal_type = EnumTypeInfo::DictType(values_count);
	switch (enum_internal_type) {
	case PhysicalType::UINT8:
		return EnumTypeInfoTemplated<uint8_t>::Deserialize(deserializer, NumericCast<uint32_t>(values_count));
	case PhysicalType::UINT16:
		return EnumTypeInfoTemplated<uint16_t>::Deserialize(deserializer, NumericCast<uint32_t>(values_count));
	case PhysicalType::UINT32:
		return EnumTypeInfoTemplated<uint32_t>::Deserialize(deserializer, NumericCast<uint32_t>(values_count));
	default:
		throw InternalException("Invalid Physical Type for ENUMs");
	}
}